

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImGui::ParseFormatTrimDecorations(char *fmt,char *buf,int buf_size)

{
  char *src;
  int iVar1;
  long lVar2;
  byte bVar3;
  
  src = ParseFormatTrimDecorationsLeading(fmt);
  if (*src == '%') {
    bVar3 = 0x25;
    lVar2 = 1;
    while (((bVar3 != 0 && (bVar3 == 0x4c || 0x19 < (byte)(bVar3 + 0xbf))) &&
           ((0x19 < (byte)(bVar3 + 0x9f) ||
            ((bVar3 - 0x68 < 0x13 && ((0x49015U >> (bVar3 - 0x68 & 0x1f) & 1) != 0))))))) {
      bVar3 = src[lVar2];
      lVar2 = lVar2 + 1;
    }
    fmt = src;
    if (src[lVar2] != '\0') {
      iVar1 = (int)lVar2 + 1;
      if (buf_size <= iVar1) {
        iVar1 = buf_size;
      }
      ImStrncpy(buf,src,(long)iVar1);
      fmt = buf;
    }
  }
  return fmt;
}

Assistant:

const char* ImGui::ParseFormatTrimDecorations(const char* fmt, char* buf, int buf_size)
{
    // We don't use strchr() because our strings are usually very short and often start with '%'
    const char* fmt_start = ParseFormatTrimDecorationsLeading(fmt);
    if (fmt_start[0] != '%')
        return fmt;
    fmt = fmt_start;
    while (char c = *fmt++)
    {
        if (c >= 'A' && c <= 'Z' && (c != 'L'))  // L is a type modifier, other letters qualify as types aka end of the format
            break;
        if (c >= 'a' && c <= 'z' && (c != 'h' && c != 'j' && c != 'l' && c != 't' && c != 'w' && c != 'z'))  // h/j/l/t/w/z are type modifiers, other letters qualify as types aka end of the format
            break;
    }
    if (fmt[0] == 0) // If we only have leading decoration, we don't need to copy the data.
        return fmt_start;
    ImStrncpy(buf, fmt_start, ImMin((int)(fmt + 1 - fmt_start), buf_size));
    return buf;
}